

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

int __thiscall
cmCTestScriptHandler::RunConfigurationScript
          (cmCTestScriptHandler *this,string *total_script_arg,bool pscope)

{
  cmCTest *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  rep rVar5;
  ostream *poVar6;
  char *pcVar7;
  pointer this_00;
  byte local_405;
  allocator<char> local_3b9;
  string local_3b8;
  undefined4 local_394;
  string local_390 [32];
  undefined1 local_370 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1f8 [48];
  undefined1 local_1c8 [8];
  ostringstream cmCTestLog_msg;
  int local_44;
  undefined1 local_40 [4];
  int result;
  SaveRestoreEnvironment sre;
  bool pscope_local;
  string *total_script_arg_local;
  cmCTestScriptHandler *this_local;
  
  sre.Env.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = pscope;
  cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment((SaveRestoreEnvironment *)local_40);
  rVar5 = std::chrono::_V2::steady_clock::now();
  (this->ScriptStartTime).__d.__r = rVar5;
  if ((sre.Env.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
    poVar6 = std::operator<<((ostream *)local_370,"Executing Script: ");
    poVar6 = std::operator<<(poVar6,(string *)total_script_arg);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0x1ef,pcVar7,false);
    std::__cxx11::string::~string(local_390);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
    local_44 = ExecuteScript(this,total_script_arg);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    poVar6 = std::operator<<((ostream *)local_1c8,"Reading Script: ");
    poVar6 = std::operator<<(poVar6,(string *)total_script_arg);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0x1eb,pcVar7,false);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    local_44 = ReadInScript(this,total_script_arg);
  }
  if (local_44 == 0) {
    bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->Makefile);
    bVar3 = false;
    bVar2 = false;
    local_405 = 0;
    if (bVar4) {
      this_00 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                          (&this->Makefile);
      std::allocator<char>::allocator();
      bVar3 = true;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,"CTEST_RUN_CURRENT_SCRIPT",&local_3b9);
      bVar2 = true;
      bVar4 = cmMakefile::IsOn(this_00,&local_3b8);
      local_405 = 0;
      if (bVar4) {
        local_405 = this->ShouldRunCurrentScript;
      }
    }
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_3b8);
    }
    if (bVar3) {
      std::allocator<char>::~allocator(&local_3b9);
    }
    if ((local_405 & 1) == 0) {
      this_local._4_4_ = local_44;
    }
    else {
      this_local._4_4_ = RunCurrentScript(this);
    }
  }
  else {
    this_local._4_4_ = local_44;
  }
  local_394 = 1;
  cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment((SaveRestoreEnvironment *)local_40)
  ;
  return this_local._4_4_;
}

Assistant:

int cmCTestScriptHandler::RunConfigurationScript(
  const std::string& total_script_arg, bool pscope)
{
#ifndef CMAKE_BOOTSTRAP
  cmSystemTools::SaveRestoreEnvironment sre;
#endif

  int result;

  this->ScriptStartTime = std::chrono::steady_clock::now();

  // read in the script
  if (pscope) {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Reading Script: " << total_script_arg << std::endl);
    result = this->ReadInScript(total_script_arg);
  } else {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Executing Script: " << total_script_arg << std::endl);
    result = this->ExecuteScript(total_script_arg);
  }
  if (result) {
    return result;
  }

  // only run the current script if we should
  if (this->Makefile && this->Makefile->IsOn("CTEST_RUN_CURRENT_SCRIPT") &&
      this->ShouldRunCurrentScript) {
    return this->RunCurrentScript();
  }
  return result;
}